

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprCodeTemp(Parse *pParse,Expr *pExpr,int *pReg)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int target;
  ExprList_item *pEVar4;
  long in_FS_OFFSET;
  Walker local_68;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (pExpr != (Expr *)0x0) {
    do {
      if ((pExpr->flags & 0x82000) == 0) break;
      if ((pExpr->flags >> 0x13 & 1) == 0) {
        if (pExpr->op != 'r') break;
        pEVar4 = (ExprList_item *)&pExpr->pLeft;
      }
      else {
        pEVar4 = ((pExpr->x).pList)->a;
      }
      pExpr = pEVar4->pExpr;
    } while (pExpr != (Expr *)0x0);
  }
  if (((pExpr != (Expr *)0x0) && (pParse->okConstFactor != '\0')) && (pExpr->op != 0xb0)) {
    local_68.u.pNC = (NameContext *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.walkerDepth = -0x55555556;
    local_68.eCode = 2;
    local_68.mWFlags = 0xaaaa;
    local_68.xExprCallback = exprNodeIsConstant;
    local_68.xSelectCallback = sqlite3SelectWalkFail;
    local_68.pParse = pParse;
    sqlite3WalkExprNN(&local_68,pExpr);
    if (local_68.eCode != 0) {
      *pReg = 0;
      iVar2 = sqlite3ExprCodeRunJustOnce(pParse,pExpr,-1);
      goto LAB_0017a190;
    }
  }
  if (pParse->nTempReg == '\0') {
    target = pParse->nMem + 1;
    pParse->nMem = target;
  }
  else {
    bVar1 = pParse->nTempReg - 1;
    pParse->nTempReg = bVar1;
    target = pParse->aTempReg[bVar1];
  }
  iVar2 = sqlite3ExprCodeTarget(pParse,pExpr,target);
  iVar3 = target;
  if ((iVar2 != target) && (iVar3 = 0, target != 0)) {
    bVar1 = pParse->nTempReg;
    if ((ulong)bVar1 < 8) {
      pParse->nTempReg = bVar1 + 1;
      pParse->aTempReg[bVar1] = target;
    }
  }
  *pReg = iVar3;
LAB_0017a190:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeTemp(Parse *pParse, Expr *pExpr, int *pReg){
  int r2;
  pExpr = sqlite3ExprSkipCollateAndLikely(pExpr);
  if( ConstFactorOk(pParse)
   && ALWAYS(pExpr!=0)
   && pExpr->op!=TK_REGISTER
   && sqlite3ExprIsConstantNotJoin(pParse, pExpr)
  ){
    *pReg  = 0;
    r2 = sqlite3ExprCodeRunJustOnce(pParse, pExpr, -1);
  }else{
    int r1 = sqlite3GetTempReg(pParse);
    r2 = sqlite3ExprCodeTarget(pParse, pExpr, r1);
    if( r2==r1 ){
      *pReg = r1;
    }else{
      sqlite3ReleaseTempReg(pParse, r1);
      *pReg = 0;
    }
  }
  return r2;
}